

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltablib.c
# Opt level: O3

int sort_comp(lua_State *L,int a,int b)

{
  int iVar1;
  
  iVar1 = lua_type(L,2);
  if (iVar1 != 0) {
    lua_pushvalue(L,2);
    lua_pushvalue(L,a + -1);
    lua_pushvalue(L,b + -2);
    lua_callk(L,2,1,0,(lua_KFunction)0x0);
    iVar1 = lua_toboolean(L,-1);
    lua_settop(L,-2);
    return iVar1;
  }
  iVar1 = lua_compare(L,a,b,1);
  return iVar1;
}

Assistant:

static int sort_comp(lua_State *L, int a, int b) {
    if (lua_isnil(L, 2))  /* no function? */
        return lua_compare(L, a, b, LUA_OPLT);  /* a < b */
    else {  /* function */
        int res;
        lua_pushvalue(L, 2);    /* push function */
        lua_pushvalue(L, a - 1);  /* -1 to compensate function */
        lua_pushvalue(L, b - 2);  /* -2 to compensate function and 'a' */
        lua_call(L, 2, 1);      /* call function */
        res = lua_toboolean(L, -1);  /* get result */
        lua_pop(L, 1);          /* pop result */
        return res;
    }
}